

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::~MoleculeStamp(MoleculeStamp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppAVar2;
  pointer ppBVar3;
  pointer ppBVar4;
  pointer ppTVar5;
  pointer ppIVar6;
  pointer ppRVar7;
  pointer ppCVar8;
  pointer ppFVar9;
  pointer ppCVar10;
  pointer piVar11;
  pointer pcVar12;
  AtomStamp **elem;
  pointer ppAVar13;
  pointer ppBVar14;
  pointer ppBVar15;
  pointer ppTVar16;
  pointer ppIVar17;
  pointer ppRVar18;
  pointer ppCVar19;
  pointer ppFVar20;
  pointer ppCVar21;
  
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__MoleculeStamp_0033d1b8;
  ppAVar2 = (this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppAVar13 = (this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppAVar13 != ppAVar2;
      ppAVar13 = ppAVar13 + 1) {
    if (*ppAVar13 != (AtomStamp *)0x0) {
      (*((*ppAVar13)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppBVar3 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar14 = (this->bondStamps_).
                  super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppBVar14 != ppBVar3;
      ppBVar14 = ppBVar14 + 1) {
    if (*ppBVar14 != (BondStamp *)0x0) {
      (*((*ppBVar14)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppBVar4 = (this->bendStamps_).
            super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar15 = (this->bendStamps_).
                  super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppBVar15 != ppBVar4;
      ppBVar15 = ppBVar15 + 1) {
    if (*ppBVar15 != (BendStamp *)0x0) {
      (*((*ppBVar15)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppTVar5 = (this->torsionStamps_).
            super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar16 = (this->torsionStamps_).
                  super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar16 != ppTVar5;
      ppTVar16 = ppTVar16 + 1) {
    if (*ppTVar16 != (TorsionStamp *)0x0) {
      (*((*ppTVar16)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppIVar6 = (this->inversionStamps_).
            super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar17 = (this->inversionStamps_).
                  super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppIVar17 != ppIVar6;
      ppIVar17 = ppIVar17 + 1) {
    if (*ppIVar17 != (InversionStamp *)0x0) {
      (*((*ppIVar17)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppRVar7 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar18 = (this->rigidBodyStamps_).
                  super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppRVar18 != ppRVar7;
      ppRVar18 = ppRVar18 + 1) {
    if (*ppRVar18 != (RigidBodyStamp *)0x0) {
      (*((*ppRVar18)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppCVar8 = (this->cutoffGroupStamps_).
            super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar19 = (this->cutoffGroupStamps_).
                  super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar19 != ppCVar8;
      ppCVar19 = ppCVar19 + 1) {
    if (*ppCVar19 != (CutoffGroupStamp *)0x0) {
      (*((*ppCVar19)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppFVar9 = (this->fragmentStamps_).
            super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar20 = (this->fragmentStamps_).
                  super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar20 != ppFVar9;
      ppFVar20 = ppFVar20 + 1) {
    if (*ppFVar20 != (FragmentStamp *)0x0) {
      (*((*ppFVar20)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppCVar10 = (this->constraintStamps_).
             super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar21 = (this->constraintStamps_).
                  super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar21 != ppCVar10;
      ppCVar21 = ppCVar21 + 1) {
    if (*ppCVar21 != (ConstraintStamp *)0x0) {
      (*((*ppCVar21)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  piVar11 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (piVar11 != (pointer)0x0) {
    operator_delete(piVar11,(long)(this->atom2Rigidbody).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)piVar11);
  }
  ppCVar21 = (this->constraintStamps_).
             super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar21 != (pointer)0x0) {
    operator_delete(ppCVar21,(long)(this->constraintStamps_).
                                   super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppCVar21);
  }
  ppFVar20 = (this->fragmentStamps_).
             super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar20 != (pointer)0x0) {
    operator_delete(ppFVar20,(long)(this->fragmentStamps_).
                                   super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppFVar20);
  }
  ppCVar19 = (this->cutoffGroupStamps_).
             super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar19 != (pointer)0x0) {
    operator_delete(ppCVar19,(long)(this->cutoffGroupStamps_).
                                   super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppCVar19);
  }
  ppRVar18 = (this->rigidBodyStamps_).
             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar18 != (pointer)0x0) {
    operator_delete(ppRVar18,(long)(this->rigidBodyStamps_).
                                   super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppRVar18);
  }
  ppIVar17 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar17 != (pointer)0x0) {
    operator_delete(ppIVar17,(long)(this->inversionStamps_).
                                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar17);
  }
  ppTVar16 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppTVar16 != (pointer)0x0) {
    operator_delete(ppTVar16,(long)(this->torsionStamps_).
                                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppTVar16);
  }
  ppBVar15 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppBVar15 != (pointer)0x0) {
    operator_delete(ppBVar15,(long)(this->bendStamps_).
                                   super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppBVar15);
  }
  ppBVar14 = (this->bondStamps_).
             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppBVar14 != (pointer)0x0) {
    operator_delete(ppBVar14,(long)(this->bondStamps_).
                                   super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppBVar14);
  }
  piVar11 = (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (piVar11 != (pointer)0x0) {
    operator_delete(piVar11,(long)(this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar11)
    ;
  }
  ppAVar13 = (this->atomStamps_).
             super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppAVar13 != (pointer)0x0) {
    operator_delete(ppAVar13,(long)(this->atomStamps_).
                                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppAVar13);
  }
  (this->ConstrainTotalCharge).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033a880;
  pcVar12 = (this->ConstrainTotalCharge).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ConstrainTotalCharge).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar12 != paVar1) {
    operator_delete(pcVar12,paVar1->_M_allocated_capacity + 1);
  }
  (this->Name).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_0033a8f0;
  pcVar12 = (this->Name).data_._M_dataplus._M_p;
  paVar1 = &(this->Name).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar12 != paVar1) {
    operator_delete(pcVar12,paVar1->_M_allocated_capacity + 1);
  }
  (this->Name).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_0033a880;
  pcVar12 = (this->Name).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Name).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar12 != paVar1) {
    operator_delete(pcVar12,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__DataHolder_0033a968;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).deprecatedKeywords_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).parameters_._M_t);
  return;
}

Assistant:

MoleculeStamp::~MoleculeStamp() {
    Utils::deletePointers(atomStamps_);
    Utils::deletePointers(bondStamps_);
    Utils::deletePointers(bendStamps_);
    Utils::deletePointers(torsionStamps_);
    Utils::deletePointers(inversionStamps_);
    Utils::deletePointers(rigidBodyStamps_);
    Utils::deletePointers(cutoffGroupStamps_);
    Utils::deletePointers(fragmentStamps_);
    Utils::deletePointers(constraintStamps_);
  }